

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O0

void __thiscall
spvtools::FriendlyNameMapper::FriendlyNameMapper
          (FriendlyNameMapper *this,spv_const_context context,uint32_t *code,size_t wordCount)

{
  spv_diagnostic local_30;
  spv_diagnostic diag;
  size_t wordCount_local;
  uint32_t *code_local;
  spv_const_context context_local;
  FriendlyNameMapper *this_local;
  
  diag = (spv_diagnostic)wordCount;
  wordCount_local = (size_t)code;
  code_local = &context->target_env;
  context_local = (spv_const_context)this;
  std::
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->name_for_id_);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->used_names_);
  AssemblyGrammar::AssemblyGrammar(&this->grammar_,(spv_const_context)code_local);
  local_30 = (spv_diagnostic)0x0;
  spvBinaryParse((spv_const_context)code_local,this,(uint32_t *)wordCount_local,(size_t)diag,
                 (spv_parsed_header_fn_t)0x0,ParseInstructionForwarder,&local_30);
  spvDiagnosticDestroy(local_30);
  return;
}

Assistant:

FriendlyNameMapper::FriendlyNameMapper(const spv_const_context context,
                                       const uint32_t* code,
                                       const size_t wordCount)
    : grammar_(AssemblyGrammar(context)) {
  spv_diagnostic diag = nullptr;
  // We don't care if the parse fails.
  spvBinaryParse(context, this, code, wordCount, nullptr,
                 ParseInstructionForwarder, &diag);
  spvDiagnosticDestroy(diag);
}